

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_ep_connect(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  ipc_ep *ep;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if ((*(byte *)((long)arg + 0x33) & 1) == 0) {
    if (*(long *)((long)arg + 0x58) == 0) {
      _Var1 = nni_aio_start(aio,ipc_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x58) = aio;
        nng_stream_dialer_dial
                  (*(nng_stream_dialer **)((long)arg + 0x38),(nng_aio *)((long)arg + 0x60));
        nni_mtx_unlock((nni_mtx *)arg);
      }
      else {
        nni_mtx_unlock((nni_mtx *)arg);
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)arg);
      nni_aio_finish_error(aio,NNG_EBUSY);
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)arg);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
ipc_ep_connect(void *arg, nni_aio *aio)
{
	ipc_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->user_aio != NULL) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}

	if (!nni_aio_start(aio, ipc_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->user_aio = aio;
	nng_stream_dialer_dial(ep->dialer, &ep->conn_aio);
	nni_mtx_unlock(&ep->mtx);
}